

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<char_*(unsigned_long)>::UntypedPerformAction
          (FunctionMockerBase<char_*(unsigned_long)> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<char_*> *pAVar1;
  Action<char_*(unsigned_long)> *in_RDX;
  ArgumentTuple *args;
  Action<char_*(unsigned_long)> action;
  Action<char_*(unsigned_long)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<char_*(unsigned_long)> local_28;
  Action<char_*(unsigned_long)> *local_18;
  
  local_18 = in_RDX;
  Action<char_*(unsigned_long)>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<char*>::PerformAction<char*(unsigned_long)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<char_*(unsigned_long)>::~Action((Action<char_*(unsigned_long)> *)0x1b7381);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }